

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

boolean lava_effects(void)

{
  obj *poVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  obj *otmp;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  burn_away_slime();
  if (youmonst.data == mons + 0x157 || youmonst.data == mons + 0xa0) {
    return '\0';
  }
  if (((u.uprops[1].intrinsic != 0 || u.uprops[1].extrinsic != 0) &&
      (((u.uprops[1].intrinsic >> 0x1a & 1) == 0 ||
       ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0)))) ||
     (((byte)youmonst.mintrinsics & 1) != 0)) goto LAB_002584f0;
  iVar7 = 6;
  if ((u.uprops[0x27].extrinsic == 0) ||
     (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
    if (((u.uprops[1].intrinsic >> 0x1a & 1) == 0) ||
       (((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0 ||
        (uVar3 = 0, ((byte)youmonst.mintrinsics & 1) != 0)))) {
      pline("You fall into the lava!");
      goto LAB_00258196;
    }
LAB_0025849d:
    if ((uVar3 & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0) {
      iVar7 = ((byte)youmonst.mintrinsics & 1) * 3 + 3;
    }
  }
  else {
    uVar3 = u.uprops[1].intrinsic;
    if ((u.uprops[1].intrinsic >> 0x1a & 1) != 0) goto LAB_0025849d;
  }
  iVar7 = dice(6,iVar7);
  pline("The lava here burns you!");
  if (u.uhp <= iVar7) {
LAB_00258196:
    bVar8 = u.uprops[0x2b].extrinsic == 0;
    bVar9 = flags.explore == '\0';
    bVar10 = flags.debug == '\0';
    poVar1 = invent;
    do {
      do {
        while( true ) {
          while( true ) {
            do {
              otmp = poVar1;
              if (otmp == (obj *)0x0) {
                u.uhp = -1;
                killer_format = 1;
                killer = "molten lava";
                pcVar5 = "You burn to a crisp...";
                do {
                  pline(pcVar5);
                  done(5);
                  bVar2 = safe_teleds('\x01');
                  pcVar5 = "You\'re still burning.";
                } while (bVar2 == '\0');
                pcVar5 = surface((int)u.ux,(int)u.uy);
                pline("You find yourself back on solid %s.",pcVar5);
                return '\x01';
              }
              poVar1 = otmp->nobj;
            } while ((0x8f < (*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0)) ||
                    ((otmp->field_0x4b & 0x10) != 0));
            if (otmp->otyp == 0x1bd) break;
            if (otmp->owornmask != 0) {
              if ((!bVar10 || !bVar8) || !bVar9) {
                aobjnam(otmp,"burst");
                pline("Your %s into flame!");
              }
              if (otmp == uarm) {
                Armor_gone((bVar10 && bVar8) && bVar9);
              }
              else if (otmp == uarmc) {
                Cloak_off();
              }
              else if (otmp == uarmh) {
                Helmet_off();
              }
              else if (otmp == uarms) {
                Shield_off();
              }
              else if (otmp == uarmg) {
                Gloves_off();
              }
              else if (otmp == uarmf) {
                Boots_off();
              }
              else if (otmp == uarmu) {
                Shirt_off();
              }
              else if ((otmp == uleft) || (otmp == uright)) {
                Ring_gone(otmp);
              }
              else if (otmp == ublindf) {
                Blindf_off(otmp,'\0');
              }
              else if (otmp == uamul) {
                Amulet_off();
              }
              else if (otmp == uwep) {
                uwepgone();
              }
              else if (otmp == uquiver) {
                uqwepgone();
              }
              else if (otmp == uswapwep) {
                uswapwepgone();
              }
            }
            useupall(otmp);
          }
          if (u.uprops[0x1e].intrinsic == 0) break;
LAB_00258229:
          if (ublindf != (obj *)0x0) {
LAB_0025822e:
            if (ublindf->oartifact == '\x1d' && ((!bVar10 || !bVar8) || !bVar9)) goto LAB_00258239;
          }
        }
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025822e;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00258229;
      } while ((bVar10 && bVar8) && bVar9);
LAB_00258239:
      pcVar5 = xname(otmp);
      pcVar5 = The(pcVar5);
      pcVar6 = hcolor("dark red");
      pline("%s glows a strange %s, but remains intact.",pcVar5,pcVar6);
    } while( true );
  }
  losehp(iVar7,"molten lava",1);
LAB_002584f0:
  if ((u.uprops[0x27].extrinsic == 0) ||
     (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
    uVar3 = mt_random();
    uVar4 = mt_random();
    u.utrap = (uVar4 & 3) * 0x100 + (uVar3 & 3) + 0xc04;
    u.utraptype = 3;
    if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
        ((pcVar5 = ", but it only burns slightly", (u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
         ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
       (pcVar5 = ", but it only burns slightly", ((byte)youmonst.mintrinsics & 1) == 0)) {
      pcVar5 = "";
    }
    pline("You sink into the lava%s!",pcVar5);
    if (1 < u.uhp) {
      losehp(1,"molten lava",1);
    }
  }
  poVar1 = uarmf;
  if (((uarmf != (obj *)0x0) && ((uarmf->field_0x4b & 0x10) == 0)) &&
     ((*(ushort *)&objects[uarmf->otyp].field_0x11 & 0x1f0) < 0x90)) {
    pcVar5 = xname(uarmf);
    pline("Your %s bursts into flame!",pcVar5);
    Boots_off();
    useup(poVar1);
  }
  destroy_item(9,2);
  destroy_item(10,2);
  destroy_item(8,2);
  return '\0';
}

Assistant:

boolean lava_effects(void)
{
    struct obj *obj, *obj2;
    int dmg;
    boolean usurvive;

    burn_away_slime();
    if (likes_lava(youmonst.data)) return FALSE;

    if (!FFire_resistance) {
	if (Wwalking || PFire_resistance) {
	    dmg = dice(6, PFire_resistance ? 3 : 6);
	    pline("The lava here burns you!");
	    if (dmg < u.uhp) {
		losehp(dmg, lava_killer, KILLED_BY);
		goto sink_in;
	    }
	} else {
	    pline("You fall into the lava!");
	}

	usurvive = Lifesaved || discover;
	if (wizard)
		usurvive = TRUE;
	
	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (is_organic(obj) && !obj->oerodeproof) {
		/* Prevent the Book of the Dead from being destroyed when
		 * the player falls into lava. */
		if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		    if (!Blind && usurvive) {
			pline("%s glows a strange %s, but remains intact.",
			      The(xname(obj)), hcolor("dark red"));
		    }
		    continue;
		}
		if (obj->owornmask) {
		    if (usurvive)
			pline("Your %s into flame!", aobjnam(obj, "burst"));

		    if (obj == uarm) Armor_gone(!usurvive);
		    else if (obj == uarmc) Cloak_off();
		    else if (obj == uarmh) Helmet_off();
		    else if (obj == uarms) Shield_off();
		    else if (obj == uarmg) Gloves_off();
		    else if (obj == uarmf) Boots_off();
		    else if (obj == uarmu) Shirt_off();
		    else if (obj == uleft) Ring_gone(obj);
		    else if (obj == uright) Ring_gone(obj);
		    else if (obj == ublindf) Blindf_off(obj, FALSE);
		    else if (obj == uamul) Amulet_off();
		    else if (obj == uwep) uwepgone();
		    else if (obj == uquiver) uqwepgone();
		    else if (obj == uswapwep) uswapwepgone();
		}
		useupall(obj);
	    }
	}

	/* s/he died... */
	u.uhp = -1;
	killer_format = KILLED_BY;
	killer = lava_killer;
	pline("You burn to a crisp...");
	done(BURNING);
	while (!safe_teleds(TRUE)) {
		pline("You're still burning.");
		done(BURNING);
	}
	pline("You find yourself back on solid %s.", surface(u.ux, u.uy));
	return TRUE;
    }

 sink_in:
    if (!Wwalking) {
	u.utrap = rn1(4, 4) + (rn1(4, 12) << 8);
	u.utraptype = TT_LAVA;
	pline("You sink into the lava%s!",
	      FFire_resistance ? ", but it only burns slightly" : "");
	if (u.uhp > 1)
	    losehp(1, lava_killer, KILLED_BY);
    }
    /* just want to burn boots, not all armor; destroy_item doesn't work on
       armor anyway */
    if (uarmf && !uarmf->oerodeproof && is_organic(uarmf)) {
	/* save uarmf value because Boots_off() sets uarmf to null */
	obj = uarmf;
	pline("Your %s bursts into flame!", xname(obj));
	Boots_off();
	useup(obj);
    }
    destroy_item(SCROLL_CLASS, AD_FIRE);
    destroy_item(SPBOOK_CLASS, AD_FIRE);
    destroy_item(POTION_CLASS, AD_FIRE);
    return FALSE;
}